

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

RESULT_TYPE __thiscall
duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
          (MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *this,
          INPUT_TYPE *input)

{
  RESULT_TYPE RVar1;
  int64_t iVar2;
  timestamp_t *in_RSI;
  undefined8 *in_RDI;
  int64_t delta;
  int64_t in_stack_00000020;
  
  duckdb::timestamp_t::operator-(in_RSI,(timestamp_t *)*in_RDI);
  iVar2 = TryAbsOperator::Operation<long,long>(in_stack_00000020);
  RVar1 = (RESULT_TYPE)duckdb::Interval::FromMicro(iVar2);
  return RVar1;
}

Assistant:

inline RESULT_TYPE operator()(const INPUT_TYPE &input) const {
		const auto delta = input - median;
		return Interval::FromMicro(TryAbsOperator::Operation<int64_t, int64_t>(delta));
	}